

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::
~FunctionMockerBase(FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>
                    *this)

{
  ~FunctionMockerBase(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }